

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O3

void Fra_OneHotAddKnownConstraint(Fra_Man_t *p,Vec_Ptr_t *vOnehots)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int pLits [2];
  int local_48;
  int local_44;
  Vec_Ptr_t *local_40;
  long local_38;
  
  if (0 < vOnehots->nSize) {
    local_38 = 0;
    local_40 = vOnehots;
    do {
      pvVar4 = local_40->pArray[local_38];
      iVar9 = *(int *)((long)pvVar4 + 4);
      if (0 < iVar9) {
        lVar10 = 1;
        lVar12 = 0;
        do {
          lVar11 = lVar12 + 1;
          if ((int)lVar11 < iVar9) {
            uVar1 = *(uint *)(*(long *)((long)pvVar4 + 8) + lVar12 * 4);
            lVar12 = lVar10;
            if ((int)uVar1 < 0) {
LAB_005d2fdf:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            do {
              pVVar5 = p->pManFraig->vCis;
              uVar2 = pVVar5->nSize;
              if ((int)uVar2 <= (int)uVar1) goto LAB_005d2fdf;
              uVar3 = *(uint *)(*(long *)((long)pvVar4 + 8) + lVar12 * 4);
              if (((int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_005d2fdf;
              ppvVar6 = pVVar5->pArray;
              pvVar7 = ppvVar6[uVar1];
              pvVar8 = ppvVar6[uVar3];
              local_48 = *(int *)(*(long *)(*(long *)((long)pvVar7 + 0x28) + 0x98) +
                                 (long)*(int *)((long)pvVar7 + 0x24) * 4) * 2 + 1;
              local_44 = *(int *)(*(long *)(*(long *)((long)pvVar8 + 0x28) + 0x98) +
                                 (long)*(int *)((long)pvVar8 + 0x24) * 4) * 2 + 1;
              iVar9 = sat_solver_addclause(p->pSat,&local_48,(lit *)&local_40);
              if (iVar9 == 0) {
                puts("Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.");
                sat_solver_delete(p->pSat);
                p->pSat = (sat_solver *)0x0;
                return;
              }
              lVar12 = lVar12 + 1;
              iVar9 = *(int *)((long)pvVar4 + 4);
            } while ((int)lVar12 < iVar9);
          }
          lVar10 = lVar10 + 1;
          lVar12 = lVar11;
        } while (lVar11 < iVar9);
      }
      local_38 = local_38 + 1;
    } while (local_38 < local_40->nSize);
  }
  return;
}

Assistant:

void Fra_OneHotAddKnownConstraint( Fra_Man_t * p, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vGroup;
    Aig_Obj_t * pObj1, * pObj2;
    int k, i, j, Out1, Out2, pLits[2];
    //
    // these constrants should be added to different timeframes!
    // (also note that PIs follow first - then registers)
    //
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, k )
    {
        Vec_IntForEachEntry( vGroup, Out1, i )
        Vec_IntForEachEntryStart( vGroup, Out2, j, i+1 )
        {
            pObj1 = Aig_ManCi( p->pManFraig, Out1 );
            pObj2 = Aig_ManCi( p->pManFraig, Out2 );
            pLits[0] = toLitCond( Fra_ObjSatNum(pObj1), 1 );
            pLits[1] = toLitCond( Fra_ObjSatNum(pObj2), 1 );
            // add constraint to solver
            if ( !sat_solver_addclause( p->pSat, pLits, pLits + 2 ) )
            {
                printf( "Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.\n" );
                sat_solver_delete( p->pSat );
                p->pSat = NULL;
                return;
            }
        }
    }
}